

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

char * sqlite3DbSpanDup(sqlite3 *db,char *zStart,char *zEnd)

{
  long lVar1;
  size_t sVar2;
  uint uVar3;
  char *__dest;
  ulong uVar4;
  uint uVar5;
  size_t __n;
  byte *__src;
  
  uVar3 = (int)zEnd - (int)zStart;
  do {
    uVar5 = uVar3;
    __src = (byte *)zStart;
    uVar4 = (ulong)uVar5;
    zStart = (char *)(__src + 1);
    uVar3 = uVar5 - 1;
  } while ((""[*__src] & 1) != 0);
  sVar2 = (long)(int)uVar5;
  do {
    __n = sVar2;
    if ((int)uVar4 < 1) break;
    lVar1 = uVar4 - 1;
    uVar4 = uVar4 - 1;
    sVar2 = __n - 1;
  } while ((""[__src[lVar1]] & 1) != 0);
  __dest = (char *)sqlite3DbMallocRawNN(db,__n + 1);
  if (__dest != (char *)0x0) {
    memcpy(__dest,__src,__n);
    __dest[__n] = '\0';
  }
  return __dest;
}

Assistant:

SQLITE_PRIVATE char *sqlite3DbSpanDup(sqlite3 *db, const char *zStart, const char *zEnd){
  int n;
  while( sqlite3Isspace(zStart[0]) ) zStart++;
  n = (int)(zEnd - zStart);
  while( ALWAYS(n>0) && sqlite3Isspace(zStart[n-1]) ) n--;
  return sqlite3DbStrNDup(db, zStart, n);
}